

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::OrphanBuilder::initData
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ByteCount size)

{
  uint size_00;
  WirePointer *ref;
  word *pwVar1;
  ThrowOverflow local_4d [13];
  undefined1 local_40 [8];
  SegmentAnd<capnp::Data::Builder> allocation;
  ByteCount size_local;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *result;
  
  allocation.value.super_ArrayPtr<unsigned_char>.size_._3_1_ = 0;
  allocation.value.super_ArrayPtr<unsigned_char>.size_._4_4_ = size;
  OrphanBuilder(__return_storage_ptr__);
  ref = tagAsPtr(__return_storage_ptr__);
  size_00 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>
                      (allocation.value.super_ArrayPtr<unsigned_char>.size_._4_4_,local_4d);
  WireHelpers::initDataPointer
            ((SegmentAnd<capnp::Data::Builder> *)local_40,ref,(SegmentBuilder *)0x0,capTable,size_00
             ,arena);
  __return_storage_ptr__->segment = (SegmentBuilder *)local_40;
  __return_storage_ptr__->capTable = capTable;
  pwVar1 = (word *)kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&allocation);
  __return_storage_ptr__->location = pwVar1;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initData(
    BuilderArena* arena, CapTableBuilder* capTable, ByteCount size) {
  OrphanBuilder result;
  auto allocation = WireHelpers::initDataPointer(result.tagAsPtr(), nullptr, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size), arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}